

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::Kernel::ByteSizeLong(Kernel *this)

{
  long lVar1;
  PolyKernel *pPVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    ((this->kernel_).linearkernel_)->_cached_size_ = 0;
    sVar5 = 2;
    break;
  case 2:
    uVar6 = -(uint)(((this->kernel_).rbfkernel_)->gamma_ != 0.0) & 1;
    ((this->kernel_).rbfkernel_)->_cached_size_ = uVar6 * 9;
    sVar5 = (ulong)uVar6 * 9 + 2;
    break;
  case 3:
    sVar5 = PolyKernel::ByteSizeLong((this->kernel_).polykernel_);
    uVar6 = (uint)sVar5 | 1;
    iVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar5 = sVar5 + (iVar3 * 9 + 0x49U >> 6) + 1;
    break;
  case 4:
    pPVar2 = (this->kernel_).polykernel_;
    uVar7 = (ulong)(-(uint)(pPVar2->c_ != 0.0) & 1);
    lVar1 = uVar7 * 9 + 9;
    lVar4 = uVar7 * 9;
    if (pPVar2->gamma_ != 0.0) {
      lVar4 = lVar1;
    }
    if (NAN(pPVar2->gamma_)) {
      lVar4 = lVar1;
    }
    pPVar2->degree_ = (int32)lVar4;
    sVar5 = lVar4 + 2;
    break;
  default:
    sVar5 = 0;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t Kernel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Kernel)
  size_t total_size = 0;

  switch (kernel_case()) {
    // .CoreML.Specification.LinearKernel linearKernel = 1;
    case kLinearKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.linearkernel_);
      break;
    }
    // .CoreML.Specification.RBFKernel rbfKernel = 2;
    case kRbfKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.rbfkernel_);
      break;
    }
    // .CoreML.Specification.PolyKernel polyKernel = 3;
    case kPolyKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.polykernel_);
      break;
    }
    // .CoreML.Specification.SigmoidKernel sigmoidKernel = 4;
    case kSigmoidKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.sigmoidkernel_);
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}